

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O0

void __thiscall dlib::drawable::enable(drawable *this)

{
  rmutex *in_RDI;
  auto_mutex M;
  rectangle *in_stack_00000048;
  base_window *in_stack_00000050;
  auto_mutex *in_stack_ffffffffffffffd0;
  
  auto_mutex::auto_mutex(in_stack_ffffffffffffffd0,in_RDI);
  (in_RDI->s).cond.__size[9] = '\x01';
  base_window::invalidate_rectangle(in_stack_00000050,in_stack_00000048);
  auto_mutex::~auto_mutex((auto_mutex *)0x4534b1);
  return;
}

Assistant:

virtual void enable (
        ) 
        {
            auto_mutex M(m);
            enabled = true;
            parent.invalidate_rectangle(rect);
        }